

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O0

void __thiscall ModelInstance::transition(ModelInstance *this,float x)

{
  reference pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator __result;
  reference pvVar4;
  bool bVar5;
  double dVar6;
  bool activatingS;
  float threshold;
  iterator __end1;
  iterator __begin1;
  array<float,_36UL> *__range1;
  int index;
  array<float,_36UL> cumulative;
  float x_local;
  ModelInstance *this_local;
  
  cumulative._M_elems[0x22] = x;
  unique0x100002f4 = this;
  pvVar1 = std::array<std::array<float,_36UL>,_36UL>::at
                     (&(this->network).transitions,(long)this->state);
  pvVar2 = std::array<float,_36UL>::begin(pvVar1);
  pvVar1 = std::array<std::array<float,_36UL>,_36UL>::at
                     (&(this->network).transitions,(long)this->state);
  pvVar3 = std::array<float,_36UL>::end(pvVar1);
  dVar6 = std::accumulate<float*,double>(pvVar2,pvVar3,0.0);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    memset((void *)((long)&__range1 + 4),0,0x90);
    pvVar1 = std::array<std::array<float,_36UL>,_36UL>::at
                       (&(this->network).transitions,(long)this->state);
    pvVar2 = std::array<float,_36UL>::begin(pvVar1);
    pvVar1 = std::array<std::array<float,_36UL>,_36UL>::at
                       (&(this->network).transitions,(long)this->state);
    pvVar3 = std::array<float,_36UL>::end(pvVar1);
    __result = std::array<float,_36UL>::begin((array<float,_36UL> *)((long)&__range1 + 4));
    std::partial_sum<float*,float*>(pvVar2,pvVar3,__result);
    __range1._0_4_ = 0;
    __end1 = std::array<float,_36UL>::begin((array<float,_36UL> *)((long)&__range1 + 4));
    pvVar2 = std::array<float,_36UL>::end((array<float,_36UL> *)((long)&__range1 + 4));
    for (; __end1 != pvVar2; __end1 = __end1 + 1) {
      if (cumulative._M_elems[0x22] < *__end1) {
        if (((this->state / 6 != 1) || (bVar5 = true, (int)__range1 != this->state + 6)) &&
           (bVar5 = false, this->state % 6 == 1)) {
          bVar5 = (int)__range1 == this->state + 1;
        }
        if (bVar5) {
          return;
        }
        if ((1 < this->state % 6) && ((int)__range1 == this->state - this->state % 6)) {
          pvVar4 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                             (&this->dimersactive,0);
          std::vector<float,_std::allocator<float>_>::push_back(pvVar4,&this->currenttime);
        }
        if ((1 < this->state / 6) && ((int)__range1 == this->state % 6)) {
          pvVar4 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                             (&this->dimersactive,1);
          std::vector<float,_std::allocator<float>_>::push_back(pvVar4,&this->currenttime);
        }
        this->state = (int)__range1;
        updateStep(this);
        return;
      }
      __range1._0_4_ = (int)__range1 + 1;
    }
  }
  return;
}

Assistant:

void ModelInstance::transition(float x) {
	// No outgoing edges, then stay in this state
	if (std::accumulate(network.transitions.at(state).begin(), network.transitions.at(state).end(), 0.0) == 0){
		return;
	}

	// Iterate over outgoing edges, find the one to take depending on the random number x
	std::array<float, 36> cumulative{};
	std::partial_sum(network.transitions.at(state).begin(), network.transitions.at(state).end(), cumulative.begin());
	int index = 0;
	for (float threshold : cumulative){
		if (x < threshold){
			//It is not one of transitions where S is activated
			bool activatingS = (state / 6 == 1 && index == state + 6) ||
							   (state % 6 == 1 && index == state + 1);
			if (!activatingS){
				if (state % 6 >= 2 && index == state - (state % 6)) {
					dimersactive.at(0).push_back(currenttime);
					//std::cout << "inactivate complex 1" << std::endl;
				}
				if (state / 6 >= 2 && index == state % 6) {
					dimersactive.at(1).push_back(currenttime);
					//std::cout << "inactivate complex 2" << std::endl;
				}
				// if not adding Si, position does not matter, else make sure it is close enough or do nothing
				state = index;
				updateStep();
			}
			break;
		}
		index++;
	}
}